

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  ImVec4 *pIVar1;
  float fVar2;
  float y0;
  ImVec2 IVar3;
  ushort uVar4;
  ImWchar c;
  uint *puVar5;
  uchar *puVar6;
  uint *puVar7;
  ImFont *this;
  undefined1 auVar8 [16];
  uint uVar9;
  ImFontAtlasCustomRect *pIVar10;
  ImFont **ppIVar11;
  ImFontGlyph *pIVar12;
  ulong uVar13;
  ulong uVar14;
  ImVector<ImFont_*> *this_00;
  int i;
  long lVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  unsigned_short uVar20;
  uint uVar21;
  ulong uVar22;
  int i_1;
  int iVar23;
  uint uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [12];
  undefined1 in_ZMM6 [64];
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec4 *local_40;
  long local_38;
  
  auVar28 = in_ZMM6._4_12_;
  if ((atlas->TexPixelsAlpha8 == (uchar *)0x0) && (atlas->TexPixelsRGBA32 == (uint *)0x0)) {
    __assert_fail("atlas->TexPixelsAlpha8 != __null || atlas->TexPixelsRGBA32 != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0xa1d,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
  }
  pIVar10 = ImFontAtlas::GetCustomRectByIndex(atlas,atlas->PackIdMouseCursors);
  uVar4 = pIVar10->X;
  if (uVar4 == 0xffff) {
    __assert_fail("r->IsPacked()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0x9ac,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
  }
  if ((atlas->Flags & 2) == 0) {
    if ((pIVar10->Width != 0xd9) || (pIVar10->Height != 0x1b)) {
      __assert_fail("r->Width == FONT_ATLAS_DEFAULT_TEX_DATA_W * 2 + 1 && r->Height == FONT_ATLAS_DEFAULT_TEX_DATA_H"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                    ,0x9b2,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,(uint)uVar4,(uint)pIVar10->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'.',0xffffffff);
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,uVar4 + 0x6d,(uint)pIVar10->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'X',0xffffffff);
    }
    else {
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,(uint)uVar4,(uint)pIVar10->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'.',0xff);
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,uVar4 + 0x6d,(uint)pIVar10->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'X',0xff);
    }
  }
  else {
    if ((pIVar10->Width != 2) || (pIVar10->Height != 2)) {
      __assert_fail("r->Width == 2 && r->Height == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                    ,0x9c3,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    iVar16 = atlas->TexWidth;
    iVar17 = (uint)pIVar10->Y * iVar16 + (uint)uVar4;
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      puVar5 = atlas->TexPixelsRGBA32;
      puVar7 = puVar5 + (iVar16 + iVar17);
      puVar7[0] = 0xffffffff;
      puVar7[1] = 0xffffffff;
      puVar5 = puVar5 + iVar17;
      puVar5[0] = 0xffffffff;
      puVar5[1] = 0xffffffff;
    }
    else {
      atlas->TexPixelsAlpha8[(long)(iVar16 + iVar17) + 1] = 0xff;
      atlas->TexPixelsAlpha8[iVar16 + iVar17] = 0xff;
      atlas->TexPixelsAlpha8[(long)iVar17 + 1] = 0xff;
      atlas->TexPixelsAlpha8[iVar17] = 0xff;
    }
  }
  uVar19._0_2_ = pIVar10->X;
  uVar19._2_2_ = pIVar10->Y;
  auVar8 = vpmovzxwd_avx(ZEXT416(uVar19));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar25._0_4_ = (atlas->TexUvScale).x * (auVar8._0_4_ + 0.5);
  auVar25._4_4_ = (atlas->TexUvScale).y * (auVar8._4_4_ + 0.5);
  auVar25._8_4_ = (auVar8._8_4_ + 0.5) * 0.0;
  auVar25._12_4_ = (auVar8._12_4_ + 0.5) * 0.0;
  IVar3 = (ImVec2)vmovlps_avx(auVar25);
  atlas->TexUvWhitePixel = IVar3;
  if ((atlas->Flags & 4) == 0) {
    pIVar10 = ImFontAtlas::GetCustomRectByIndex(atlas,atlas->PackIdLines);
    uVar20 = pIVar10->X;
    if (uVar20 == 0xffff) {
      __assert_fail("r->IsPacked()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                    ,0x9d8,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
    }
    local_40 = atlas->TexUvLines;
    lVar15 = 0;
    iVar16 = 0;
    iVar17 = 0;
    uVar18 = 0;
    while (uVar18 != 0x40) {
      if (pIVar10->Height <= uVar18) {
        __assert_fail("pad_left + line_width + pad_right == r->Width && y < r->Height",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                      ,0x9e2,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
      }
      uVar19 = (uint)pIVar10->Width;
      puVar6 = atlas->TexPixelsAlpha8;
      uVar21 = (uint)uVar20;
      if (puVar6 == (uchar *)0x0) {
        puVar7 = atlas->TexPixelsRGBA32;
        uVar24 = (uint)pIVar10->Y;
        uVar22 = (ulong)((iVar16 + uVar24) * atlas->TexWidth + uVar21);
        uVar9 = iVar17 + uVar19 >> 1;
        uVar13 = (ulong)uVar9;
        for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
          puVar7[uVar22 + uVar14] = 0;
        }
        for (uVar14 = 0; uVar18 != uVar14; uVar14 = uVar14 + 1) {
          puVar7[uVar13 + uVar22 + uVar14] = 0xffffffff;
        }
        for (uVar14 = 0; local_38 = lVar15, (iVar17 + uVar19) - uVar9 != uVar14; uVar14 = uVar14 + 1
            ) {
          *(undefined4 *)((long)puVar7 + uVar14 * 4 + lVar15 + uVar13 * 4 + uVar22 * 4) = 0;
        }
      }
      else {
        uVar22 = (ulong)(((uint)pIVar10->Y + iVar16) * atlas->TexWidth + uVar21);
        uVar21 = iVar17 + uVar19 >> 1;
        uVar14 = (ulong)uVar21;
        for (uVar13 = 0; uVar14 != uVar13; uVar13 = uVar13 + 1) {
          puVar6[uVar13 + uVar22] = '\0';
        }
        for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
          puVar6[uVar13 + uVar22 + uVar14] = 0xff;
        }
        for (uVar13 = 0; (iVar17 + uVar19) - uVar21 != uVar13; uVar13 = uVar13 + 1) {
          puVar6[uVar13 + uVar22 + uVar14 + uVar18] = '\0';
        }
        uVar20 = pIVar10->X;
        uVar21 = (uint)uVar20;
        uVar24 = (uint)pIVar10->Y;
      }
      iVar23 = uVar24 + (int)uVar18;
      uVar19 = uVar19 - (int)uVar18 >> 1;
      auVar26._0_4_ = (float)((uVar21 + uVar19) - 1);
      auVar26._4_12_ = auVar28;
      fVar2 = (atlas->TexUvScale).y;
      auVar27._0_4_ = (float)(uVar21 + uVar19 + (int)(uVar18 + 1));
      auVar27._4_12_ = auVar28;
      auVar8 = vinsertps_avx(ZEXT416((uint)(atlas->TexUvScale).x),
                             ZEXT416((uint)(fVar2 * (float)iVar23 + fVar2 * (float)(iVar23 + 1))),
                             0x10);
      auVar25 = vinsertps_avx(auVar26,SUB6416(ZEXT464(0x3f000000),0),0x10);
      auVar25 = vinsertps_avx(auVar25,auVar27,0x20);
      auVar25 = vinsertps_avx(auVar25,SUB6416(ZEXT464(0x3f000000),0),0x30);
      pIVar1 = local_40 + uVar18;
      pIVar1->x = auVar8._0_4_ * auVar25._0_4_;
      pIVar1->y = auVar8._4_4_ * auVar25._4_4_;
      pIVar1->z = auVar8._0_4_ * auVar25._8_4_;
      pIVar1->w = auVar8._4_4_ * auVar25._12_4_;
      iVar17 = iVar17 + -1;
      iVar16 = iVar16 + 1;
      lVar15 = lVar15 + 4;
      uVar18 = uVar18 + 1;
    }
  }
  for (iVar16 = 0; iVar16 < (atlas->CustomRects).Size; iVar16 = iVar16 + 1) {
    pIVar10 = ImVector<ImFontAtlasCustomRect>::operator[](&atlas->CustomRects,iVar16);
    if ((pIVar10->Font != (ImFont *)0x0) && (pIVar10->GlyphID != 0)) {
      if (pIVar10->Font->ContainerAtlas != atlas) {
        __assert_fail("r->Font->ContainerAtlas == atlas",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                      ,0xa29,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
      }
      local_48.x = 0.0;
      local_48.y = 0.0;
      local_50.x = 0.0;
      local_50.y = 0.0;
      ImFontAtlas::CalcCustomRectUV(atlas,pIVar10,&local_48,&local_50);
      fVar2 = (pIVar10->GlyphOffset).x;
      y0 = (pIVar10->GlyphOffset).y;
      ImFont::AddGlyph(pIVar10->Font,(ImFontConfig *)0x0,(ImWchar)pIVar10->GlyphID,fVar2,y0,
                       fVar2 + (float)pIVar10->Width,y0 + (float)pIVar10->Height,local_48.x,
                       local_48.y,local_50.x,local_50.y,pIVar10->GlyphAdvanceX);
    }
  }
  this_00 = &atlas->Fonts;
  for (iVar16 = 0; iVar17 = this_00->Size, iVar16 < iVar17; iVar16 = iVar16 + 1) {
    ppIVar11 = ImVector<ImFont_*>::operator[](this_00,iVar16);
    if ((*ppIVar11)->DirtyLookupTables == true) {
      ppIVar11 = ImVector<ImFont_*>::operator[](this_00,iVar16);
      ImFont::BuildLookupTable(*ppIVar11);
    }
  }
  iVar16 = 0;
  do {
    if (iVar17 <= iVar16) {
      return;
    }
    ppIVar11 = ImVector<ImFont_*>::operator[](this_00,iVar16);
    this = *ppIVar11;
    if (this->EllipsisChar == 0xffff) {
      lVar15 = 0;
      do {
        if (lVar15 == 4) goto LAB_0017f669;
        c = *(ImWchar *)((long)&DAT_001dd8b0 + lVar15);
        pIVar12 = ImFont::FindGlyphNoFallback(this,c);
        lVar15 = lVar15 + 2;
      } while (pIVar12 == (ImFontGlyph *)0x0);
      this->EllipsisChar = c;
    }
LAB_0017f669:
    iVar16 = iVar16 + 1;
    iVar17 = this_00->Size;
  } while( true );
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL || atlas->TexPixelsRGBA32 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    // Ellipsis character is required for rendering elided text. We prefer using U+2026 (horizontal ellipsis).
    // However some old fonts may contain ellipsis at U+0085. Here we auto-detect most suitable ellipsis character.
    // FIXME: Also note that 0x2026 is currently seldom included in our font ranges. Because of this we are more likely to use three individual dots.
    for (int i = 0; i < atlas->Fonts.size(); i++)
    {
        ImFont* font = atlas->Fonts[i];
        if (font->EllipsisChar != (ImWchar)-1)
            continue;
        const ImWchar ellipsis_variants[] = { (ImWchar)0x2026, (ImWchar)0x0085 };
        for (int j = 0; j < IM_ARRAYSIZE(ellipsis_variants); j++)
            if (font->FindGlyphNoFallback(ellipsis_variants[j]) != NULL) // Verify glyph exists
            {
                font->EllipsisChar = ellipsis_variants[j];
                break;
            }
    }
}